

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar5 = (*mf->find)(mf,matches);
  if (uVar5 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = mf->nice_len;
    uVar11 = 0;
    do {
      if (uVar7 < matches[uVar11].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar9 = mf->read_pos;
      if (uVar9 <= matches[uVar11].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      iVar6 = bcmp(mf->buffer + ((ulong)uVar9 - 1),
                   mf->buffer + ((ulong)uVar9 - (ulong)matches[uVar11].dist) + -2,
                   (ulong)matches[uVar11].len);
      if (iVar6 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
    uVar9 = matches[uVar5 - 1].len;
    uVar7 = uVar9;
    if (uVar9 == mf->nice_len) {
      uVar1 = mf->read_pos;
      uVar8 = (mf->write_pos - uVar1) + 1;
      if (mf->match_len_max <= uVar8) {
        uVar8 = mf->match_len_max;
      }
      if (uVar8 < uVar9) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)uVar8 < 0) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      uVar11 = ~(ulong)matches[uVar5 - 1].dist;
      lVar4 = uVar11 + uVar1;
      do {
        uVar7 = uVar8;
        if (uVar8 <= uVar9) break;
        lVar2 = *(long *)(mf->buffer + (ulong)uVar9 + ((ulong)uVar1 - 1));
        lVar3 = *(long *)(mf->buffer + (ulong)uVar9 + lVar4 + -1);
        uVar10 = lVar2 - lVar3;
        if (uVar10 == 0) {
          uVar9 = uVar9 + 8;
        }
        else {
          uVar11 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          uVar9 = ((uint)(uVar11 >> 3) & 0x1fffffff) + uVar9;
          if (uVar9 < uVar8) {
            uVar7 = uVar9;
          }
          uVar11 = (ulong)uVar7;
        }
        uVar7 = (uint)uVar11;
      } while (lVar2 == lVar3);
    }
  }
  *count_ptr = uVar5;
  mf->read_ahead = mf->read_ahead + 1;
  return uVar7;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		// Validate the matches.
		for (uint32_t i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			const uint8_t *p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			const uint8_t *p2 = p1 - matches[count - 1].dist - 1;

			len_best = lzma_memcmplen(p1, p2, len_best, limit);
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}